

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidget::event(QWidget *this,QEvent *event)

{
  QWidget *pQVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  quint16 qVar6;
  Type TVar7;
  SurfaceEventType SVar8;
  Int IVar9;
  uint uVar10;
  Int IVar11;
  WindowType WVar12;
  Int IVar13;
  int iVar14;
  int iVar15;
  QWidgetPrivate *pQVar16;
  QStyle *pQVar17;
  QPalette *pQVar18;
  ulong uVar19;
  QWidget *pQVar20;
  const_reference ppQVar21;
  QPoint *text;
  QTLWExtra *pQVar22;
  long lVar23;
  long *plVar24;
  QFontPrivate *pQVar25;
  qsizetype qVar26;
  pointer pQVar27;
  QWindow *pQVar28;
  uint *__addr_len;
  socklen_t *__addr_len_00;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  QUpdateLaterEvent *in_RSI;
  QUpdateLaterEvent *pQVar29;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  char axis;
  uint value;
  QByteArray *propName;
  QWindow *win;
  QTLWExtra *te;
  QWidget *w_2;
  int i_4;
  QWidget *w_1;
  QObject *o_1;
  int i_3;
  QWidget *modalWidget;
  QObject *o;
  int i_2;
  QWidget *w;
  int i_1;
  QWidget *widget;
  bool wasMinimized;
  InputMethodQuery q;
  uint i;
  QInputMethodQueryEvent *query;
  bool res;
  QKeyEvent *k;
  QWidgetPrivate *d;
  QList<QObject_*> childList_2;
  QList<QObject_*> childList_1;
  QList<QObject_*> childList;
  QHideEvent hideEvent;
  QShowEvent showEvent;
  QStatusTipEvent tip_1;
  QString empty;
  QStatusTipEvent tip;
  InputMethodQueries queries;
  QVariant v;
  undefined4 in_stack_fffffffffffffc68;
  WindowState in_stack_fffffffffffffc6c;
  QWidgetPrivate *in_stack_fffffffffffffc70;
  WidgetAttribute attribute;
  QWidgetPrivate *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  quint16 in_stack_fffffffffffffc84;
  quint16 in_stack_fffffffffffffc86;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  QRect *in_stack_fffffffffffffc90;
  QWidgetPrivate *in_stack_fffffffffffffc98;
  undefined2 uVar30;
  QWidgetPrivate *in_stack_fffffffffffffca0;
  QPoint *pos;
  QWidgetPrivate *in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  undefined2 uVar31;
  WId in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined1 uVar32;
  WidgetAttribute in_stack_fffffffffffffcd4;
  QWidget *in_stack_fffffffffffffcd8;
  QFont *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  int local_2c4;
  int local_2ac;
  int local_294;
  int local_284;
  uint local_26c;
  byte local_259;
  bool local_229;
  QByteArray local_228;
  QList<QObject_*> local_210;
  QList<QObject_*> local_1e8;
  QList<QObject_*> local_1d0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  QFlagsStorageHelper<Qt::WindowState,_4> local_198;
  QFlagsStorageHelper<Qt::WindowState,_4> local_194;
  QStatusTipEvent local_190 [40];
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  QStatusTipEvent local_150 [40];
  QFlagsStorageHelper<Qt::InputMethodQuery,_4> local_128;
  QFlagsStorageHelper<Qt::InputMethodQuery,_4> local_124;
  undefined1 local_120 [16];
  QPoint local_110;
  QPoint local_108;
  undefined4 local_100;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_fc;
  undefined4 local_f8;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_f4;
  undefined4 local_f0;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_ec;
  QPalette local_e8;
  QPalette local_d8;
  QFont local_c8 [16];
  QFont local_b8 [16];
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  uVar31 = (undefined2)((ulong)in_stack_fffffffffffffcc0 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar29 = in_RSI;
  pQVar16 = d_func((QWidget *)0x37af81);
  bVar2 = isEnabled((QWidget *)0x37af96);
  if (!bVar2) {
    TVar7 = QEvent::type(&in_RSI->super_QEvent);
    if ((((TVar7 - MouseButtonPress < 6) || (TVar7 == Wheel)) || (TVar7 == ContextMenu)) ||
       (((TVar7 == TabletMove || (TVar7 - TabletPress < 2)) ||
        ((TVar7 - TouchBegin < 3 || (TVar7 == TouchCancel)))))) {
      local_229 = false;
      goto LAB_0037c944;
    }
  }
  TVar7 = QEvent::type(&in_RSI->super_QEvent);
  iVar15 = (int)pQVar29;
  __addr_len = &switchD_0037b06a::switchdataD_00aa0f28;
  switch(TVar7) {
  case MouseButtonPress:
    (**(code **)(*(long *)in_RDI + 0x98))(in_RDI,in_RSI);
    break;
  case MouseButtonRelease:
    (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,in_RSI);
    break;
  case MouseButtonDblClick:
    (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,in_RSI);
    break;
  case MouseMove:
    (**(code **)(*(long *)in_RDI + 0xb0))(in_RDI,in_RSI);
    break;
  case KeyPress:
    local_259 = 0;
    local_f0 = QKeyEvent::modifiers();
    Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                  (enum_type)in_stack_fffffffffffffc70);
    local_ec.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffc70,
                    (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(in_stack_fffffffffffffc78,0)
                   );
    bVar2 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_ec);
    if (bVar2) {
      uVar10 = QKeyEvent::key((QKeyEvent *)in_RSI);
      __addr_len = (uint *)(ulong)uVar10;
      bVar2 = true;
      if (uVar10 != 0x1000002) {
        uVar10 = QKeyEvent::key((QKeyEvent *)in_RSI);
        __addr_len = (uint *)(ulong)uVar10;
        bVar2 = false;
        if (uVar10 == 0x1000001) {
          local_f8 = QKeyEvent::modifiers();
          local_f4.super_QFlagsStorage<Qt::KeyboardModifier>.i =
               (QFlagsStorage<Qt::KeyboardModifier>)
               QFlags<Qt::KeyboardModifier>::operator&
                         ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffc70,
                          in_stack_fffffffffffffc6c);
          IVar9 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_f4);
          bVar2 = IVar9 != 0;
        }
      }
      if (bVar2) {
        local_259 = (**(code **)(*(long *)in_RDI + 0x198))(in_RDI,0);
        local_259 = local_259 & 1;
      }
      else {
        iVar15 = QKeyEvent::key((QKeyEvent *)in_RSI);
        if (iVar15 == 0x1000001) {
          local_259 = (**(code **)(*(long *)in_RDI + 0x198))(in_RDI,1);
          local_259 = local_259 & 1;
        }
      }
      if (local_259 != 0) break;
    }
    (**(code **)(*(long *)in_RDI + 0xc0))(in_RDI,in_RSI);
    bVar3 = QEvent::isAccepted(&in_RSI->super_QEvent);
    __addr_len_00 = (socklen_t *)CONCAT71((int7)((ulong)__addr_len >> 8),bVar3);
    bVar2 = false;
    if (!bVar3) {
      local_100 = QKeyEvent::modifiers();
      local_fc.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffc70,
                      in_stack_fffffffffffffc6c);
      IVar9 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_fc);
      __addr_len_00 = (socklen_t *)(ulong)IVar9;
      bVar2 = false;
      if (IVar9 != 0) {
        uVar10 = QKeyEvent::key((QKeyEvent *)in_RSI);
        __addr_len_00 = (socklen_t *)(ulong)uVar10;
        bVar2 = false;
        if (uVar10 == 0x1000030) {
          qVar26 = QString::size(&pQVar16->whatsThis);
          bVar2 = qVar26 != 0;
        }
      }
    }
    if (bVar2) {
      (**(code **)(*(long *)in_RDI + 400))(&local_28,in_RDI,2);
      local_120 = ::QVariant::toRect();
      local_110 = QRect::center(in_stack_fffffffffffffc90);
      local_108 = mapToGlobal((QWidget *)
                              CONCAT26(in_stack_fffffffffffffc86,
                                       CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                                      ),(QPoint *)in_stack_fffffffffffffc78);
      iVar15 = (int)pQVar16 + 0x120;
      QWhatsThis::showText
                ((QPoint *)in_stack_fffffffffffffc90,
                 (QString *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 (QWidget *)
                 CONCAT26(in_stack_fffffffffffffc86,
                          CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)));
      ::QVariant::~QVariant(&local_28);
      QEvent::accept(&in_RSI->super_QEvent,iVar15,__addr,__addr_len_00);
    }
    break;
  case KeyRelease:
    (**(code **)(*(long *)in_RDI + 200))(in_RDI,in_RSI);
  case ShortcutOverride:
    break;
  case FocusIn:
    (**(code **)(*(long *)in_RDI + 0xd0))(in_RDI,in_RSI);
    QWidgetPrivate::updateWidgetTransform
              (in_stack_fffffffffffffca0,(QEvent *)in_stack_fffffffffffffc98);
    break;
  case FocusOut:
    (**(code **)(*(long *)in_RDI + 0xd8))(in_RDI,in_RSI);
    break;
  case Enter:
    qVar26 = QString::size(&pQVar16->statusTip);
    if (qVar26 != 0) {
      memset(local_150,0xaa,0x28);
      QStatusTipEvent::QStatusTipEvent(local_150,(QString *)&pQVar16->statusTip);
      QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)local_150);
      QStatusTipEvent::~QStatusTipEvent(local_150);
    }
    (**(code **)(*(long *)in_RDI + 0xe0))(in_RDI,in_RSI);
    break;
  case Leave:
    qVar26 = QString::size(&pQVar16->statusTip);
    if (qVar26 != 0) {
      local_168 = &DAT_aaaaaaaaaaaaaaaa;
      local_160 = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x37b98f);
      memset(local_190,0xaa,0x28);
      QStatusTipEvent::QStatusTipEvent(local_190,(QString *)&local_168);
      QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)local_190);
      QStatusTipEvent::~QStatusTipEvent(local_190);
      QString::~QString((QString *)0x37b9ea);
    }
    (**(code **)(*(long *)in_RDI + 0xe8))(in_RDI,in_RSI);
    break;
  case Paint:
    (**(code **)(*(long *)in_RDI + 0xf0))(in_RDI,in_RSI);
    break;
  case Move:
    (**(code **)(*(long *)in_RDI + 0xf8))(in_RDI,in_RSI);
    QWidgetPrivate::updateWidgetTransform
              (in_stack_fffffffffffffca0,(QEvent *)in_stack_fffffffffffffc98);
    break;
  case Resize:
    (**(code **)(*(long *)in_RDI + 0x100))(in_RDI,in_RSI);
    QWidgetPrivate::updateWidgetTransform
              (in_stack_fffffffffffffca0,(QEvent *)in_stack_fffffffffffffc98);
    break;
  default:
    goto switchD_0037b06a_caseD_f;
  case Show:
    (**(code **)(*(long *)in_RDI + 0x148))(in_RDI,in_RSI);
    break;
  case Hide:
    (**(code **)(*(long *)in_RDI + 0x150))(in_RDI,in_RSI);
    break;
  case Close:
    (**(code **)(*(long *)in_RDI + 0x108))(in_RDI,in_RSI);
    break;
  case ParentChange:
  case WindowTitleChange:
  case PaletteChange:
  case LocaleChange:
  case FontChange:
  case EnabledChange:
  case ActivationChange:
  case StyleChange:
  case IconTextChange:
  case ModifiedChange:
  case ReadOnlyChange:
  case MouseTrackingChange:
  case ToolBarChange:
  case MacSizeChange:
  case ContentsRectChange:
  case ThemeChange:
  case TabletTrackingChange:
    (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI);
    break;
  case WindowActivate:
  case WindowDeactivate:
    bVar2 = isVisible((QWidget *)0x37bec5);
    if (bVar2) {
      pQVar18 = palette((QWidget *)in_stack_fffffffffffffc70);
      uVar19 = QPalette::isEqual((ColorGroup)pQVar18,Active);
      if ((uVar19 & 1) == 0) {
        update((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      }
    }
    local_1d0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_1d0.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_1d0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QObject_*>::QList
              ((QList<QObject_*> *)in_stack_fffffffffffffc70,
               (QList<QObject_*> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_284 = 0;
    while( true ) {
      lVar23 = (long)local_284;
      qVar26 = QList<QObject_*>::size(&local_1d0);
      if (qVar26 <= lVar23) break;
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_fffffffffffffc70,
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      pQVar20 = qobject_cast<QWidget*>
                          ((QObject *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
      ;
      if (((pQVar20 != (QWidget *)0x0) && (bVar2 = isVisible((QWidget *)0x37bfb1), bVar2)) &&
         (bVar2 = isWindow((QWidget *)in_stack_fffffffffffffc70), !bVar2)) {
        QCoreApplication::sendEvent(&pQVar20->super_QObject,&in_RSI->super_QEvent);
      }
      local_284 = local_284 + 1;
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x37c002);
    break;
  case Wheel:
    (**(code **)(*(long *)in_RDI + 0xb8))(in_RDI,in_RSI);
    break;
  case ApplicationWindowIconChange:
    bVar2 = isWindow((QWidget *)in_stack_fffffffffffffc70);
    if (bVar2) {
      bVar2 = testAttribute((QWidget *)in_stack_fffffffffffffc78,
                            (WidgetAttribute)((ulong)in_stack_fffffffffffffc70 >> 0x20));
      if (!bVar2) {
        QWidgetPrivate::setWindowIcon_sys
                  ((QWidgetPrivate *)
                   CONCAT26(in_stack_fffffffffffffc86,
                            CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)));
        QWidgetPrivate::setWindowIcon_helper
                  ((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
    }
    break;
  case ApplicationFontChange:
    QWidgetPrivate::resolveFont
              ((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    break;
  case ApplicationLayoutDirectionChange:
    QWidgetPrivate::resolveLayoutDirection
              ((QWidgetPrivate *)
               CONCAT26(in_stack_fffffffffffffc86,
                        CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)));
    break;
  case ApplicationPaletteChange:
    WVar12 = windowType((QWidget *)in_stack_fffffffffffffc70);
    if (WVar12 != Desktop) {
      QWidgetPrivate::resolvePalette(in_stack_fffffffffffffc78);
    }
    break;
  case DragEnter:
    (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,in_RSI);
    break;
  case DragMove:
    (**(code **)(*(long *)in_RDI + 0x130))(in_RDI,in_RSI);
    break;
  case DragLeave:
    (**(code **)(*(long *)in_RDI + 0x138))(in_RDI,in_RSI);
    break;
  case Drop:
    (**(code **)(*(long *)in_RDI + 0x140))(in_RDI,in_RSI);
    break;
  case ShowWindowRequest:
    bVar2 = isHidden((QWidget *)0x37bc65);
    if (!bVar2) {
      QWidgetPrivate::show_sys(in_stack_fffffffffffffcb8);
    }
    break;
  case PolishRequest:
    ensurePolished((QWidget *)in_stack_fffffffffffffc98);
    break;
  case Polish:
    pQVar17 = style((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    uVar32 = (undefined1)((uint)in_stack_fffffffffffffcd0 >> 0x18);
    (**(code **)(*(long *)pQVar17 + 0x60))(pQVar17,in_RDI);
    setAttribute(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,(bool)uVar32);
    QApplication::font((QWidget *)in_stack_fffffffffffffca0);
    QApplication::font();
    bVar5 = QFont::isCopyOf(local_b8);
    QFont::~QFont(local_c8);
    QFont::~QFont(local_b8);
    if (((bVar5 ^ 0xff) & 1) != 0) {
      QWidgetPrivate::resolveFont
                ((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    QApplication::palette((QWidget *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QGuiApplication::palette();
    bVar5 = QPalette::isCopyOf((QPalette *)&local_d8);
    bVar5 = bVar5 ^ 0xff;
    QPalette::~QPalette(&local_e8);
    QPalette::~QPalette(&local_d8);
    if ((bVar5 & 1) != 0) {
      QWidgetPrivate::resolvePalette(in_stack_fffffffffffffc78);
    }
    break;
  case UpdateRequest:
    QWidgetPrivate::syncBackingStore(in_stack_fffffffffffffc70);
    break;
  case UpdateLater:
    QUpdateLaterEvent::region(in_RSI);
    update((QWidget *)
           CONCAT26(in_stack_fffffffffffffc86,
                    CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)),
           (QRegion *)in_stack_fffffffffffffc78);
    break;
  case EmbeddingControl:
    QWidgetPrivate::topData(in_stack_fffffffffffffc70);
    QRect::setCoords((QRect *)CONCAT26(in_stack_fffffffffffffc86,
                                       CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                                      ),(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                     (int)in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                     (int)in_stack_fffffffffffffc70);
    *(uint *)&in_RDI->data->field_0x10 = *(uint *)&in_RDI->data->field_0x10 & 0xffffefff;
    break;
  case ContextMenu:
    switch(*(uint *)&in_RDI->data->field_0x10 >> 0xd & 7) {
    case 1:
      (**(code **)(*(long *)in_RDI + 0x110))(in_RDI,in_RSI);
      break;
    case 2:
      qVar26 = QList<QAction_*>::size(&pQVar16->actions);
      if (qVar26 == 0) goto switchD_0037baf6_default;
      QContextMenuEvent::globalPos((QContextMenuEvent *)in_RSI);
      QMenu::exec((QList<QAction_*> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                  (QPoint *)
                  CONCAT26(in_stack_fffffffffffffc86,
                           CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)),
                  (QAction *)in_stack_fffffffffffffc78,(QWidget *)in_stack_fffffffffffffc70);
      break;
    case 3:
      QContextMenuEvent::pos((QContextMenuEvent *)in_RSI);
      customContextMenuRequested
                ((QWidget *)in_stack_fffffffffffffc70,
                 (QPoint *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      break;
    case 4:
      break;
    default:
switchD_0037baf6_default:
      QEvent::ignore(&in_RSI->super_QEvent);
    }
    break;
  case InputMethod:
    (**(code **)(*(long *)in_RDI + 0x188))(in_RDI,in_RSI);
    break;
  case TabletMove:
    QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_fffffffffffffc70);
    bVar2 = ::operator==((QFlagsStorageHelper<Qt::MouseButton,_4>)
                         SUB84((ulong)in_stack_fffffffffffffc78 >> 0x20,0),
                         (MouseButton)in_stack_fffffffffffffc70);
    if (bVar2) {
      bVar2 = testAttribute((QWidget *)in_stack_fffffffffffffc78,
                            (WidgetAttribute)((ulong)in_stack_fffffffffffffc70 >> 0x20));
      if (!bVar2) break;
    }
  case TabletPress:
  case TabletRelease:
    (**(code **)(*(long *)in_RDI + 0x118))(in_RDI,in_RSI);
    break;
  case LanguageChange:
    (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI);
    local_1e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_1e8.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_1e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QObject_*>::QList
              ((QList<QObject_*> *)in_stack_fffffffffffffc70,
               (QList<QObject_*> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_294 = 0;
    while( true ) {
      lVar23 = (long)local_294;
      qVar26 = QList<QObject_*>::size(&local_1e8);
      if (qVar26 <= lVar23) break;
      ppQVar21 = QList<QObject_*>::at
                           ((QList<QObject_*> *)in_stack_fffffffffffffc70,
                            CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      if (*ppQVar21 != (QObject *)0x0) {
        QCoreApplication::sendEvent(*ppQVar21,&in_RSI->super_QEvent);
      }
      local_294 = local_294 + 1;
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x37c0fa);
    update((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    break;
  case LayoutDirectionChange:
    if (pQVar16->layout != (QLayout *)0x0) {
      (**(code **)(*(long *)pQVar16->layout + 0x70))();
    }
    update((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI);
    break;
  case WindowBlocked:
  case WindowUnblocked:
    bVar2 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x37c200);
    if (!bVar2) {
      pQVar20 = QApplication::activeModalWidget();
      local_2ac = 0;
      while( true ) {
        lVar23 = (long)local_2ac;
        qVar26 = QList<QObject_*>::size((QList<QObject_*> *)&pQVar16->field_0x18);
        if (qVar26 <= lVar23) break;
        ppQVar21 = QList<QObject_*>::at
                             ((QList<QObject_*> *)in_stack_fffffffffffffc70,
                              CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        pQVar1 = (QWidget *)*ppQVar21;
        if (((pQVar1 != (QWidget *)0x0) && (pQVar1 != pQVar20)) &&
           ((bVar2 = QObject::isWidgetType((QObject *)0x37c29d), bVar2 &&
            (bVar2 = isWindow((QWidget *)in_stack_fffffffffffffc70), !bVar2)))) {
          QCoreApplication::sendEvent((QObject *)pQVar1,&in_RSI->super_QEvent);
        }
        local_2ac = local_2ac + 1;
      }
    }
    break;
  case WindowStateChange:
    local_198.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorage<Qt::WindowState>)
         QWindowStateChangeEvent::oldState((QWindowStateChangeEvent *)in_stack_fffffffffffffc70);
    uVar32 = (undefined1)((ulong)in_stack_fffffffffffffc90 >> 0x38);
    local_194.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorage<Qt::WindowState>)
         QFlags<Qt::WindowState>::operator&
                   ((QFlags<Qt::WindowState> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
    IVar13 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_194);
    uVar10 = (uint)(IVar13 != 0);
    bVar2 = isMinimized(in_RDI);
    if (uVar10 != bVar2) {
      if (IVar13 != 0) {
        if ((*(uint *)&pQVar16->field_0x250 >> 0x1e & 1) == 0) {
          QWidgetPrivate::showChildren(in_stack_fffffffffffffc98,(bool)uVar32);
          local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
          QShowEvent::QShowEvent((QShowEvent *)&local_1a8);
          QCoreApplication::sendSpontaneousEvent(&in_RDI->super_QObject,(QEvent *)&local_1a8);
          QShowEvent::~QShowEvent((QShowEvent *)&local_1a8);
        }
        *(uint *)&pQVar16->field_0x250 = *(uint *)&pQVar16->field_0x250 & 0xdfffffff;
      }
      else {
        local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
        QHideEvent::QHideEvent((QHideEvent *)&local_1b8);
        QCoreApplication::sendSpontaneousEvent(&in_RDI->super_QObject,(QEvent *)&local_1b8);
        QWidgetPrivate::hideChildren(in_stack_fffffffffffffc98,(bool)uVar32);
        *(uint *)&pQVar16->field_0x250 = *(uint *)&pQVar16->field_0x250 & 0xdfffffff | 0x20000000;
        QHideEvent::~QHideEvent((QHideEvent *)&local_1b8);
      }
      *(uint *)&pQVar16->field_0x250 = *(uint *)&pQVar16->field_0x250 & 0xbfffffff;
    }
    (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI);
    break;
  case ToolTip:
    bVar2 = QString::isEmpty((QString *)0x37c30e);
    iVar15 = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
    if (bVar2) {
      QEvent::ignore(&in_RSI->super_QEvent);
    }
    else {
      text = QHelpEvent::globalPos((QHelpEvent *)in_RSI);
      pos = (QPoint *)&pQVar16->toolTip;
      QRect::QRect((QRect *)in_stack_fffffffffffffc70);
      QToolTip::showText(pos,(QString *)text,(QWidget *)in_stack_fffffffffffffca0,
                         (QRect *)in_stack_fffffffffffffc98,iVar15);
    }
    break;
  case WhatsThis:
    qVar26 = QString::size(&pQVar16->whatsThis);
    if (qVar26 == 0) {
      QEvent::ignore(&in_RSI->super_QEvent);
    }
    else {
      QHelpEvent::globalPos((QHelpEvent *)in_RSI);
      QWhatsThis::showText
                ((QPoint *)in_stack_fffffffffffffc90,
                 (QString *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 (QWidget *)
                 CONCAT26(in_stack_fffffffffffffc86,
                          CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)));
    }
    break;
  case ActionChanged:
  case ActionAdded:
  case ActionRemoved:
    (**(code **)(*(long *)in_RDI + 0x120))(in_RDI,in_RSI);
    break;
  case QueryWhatsThis:
    bVar2 = QString::isEmpty((QString *)0x37c3f4);
    if (bVar2) {
      QEvent::ignore(&in_RSI->super_QEvent);
    }
    break;
  case HoverEnter:
  case HoverLeave:
    update((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    break;
  case KeyboardLayoutChange:
    (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI);
    local_210.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_210.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_210.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QObject_*>::QList
              ((QList<QObject_*> *)in_stack_fffffffffffffc70,
               (QList<QObject_*> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_2c4 = 0;
    while( true ) {
      lVar23 = (long)local_2c4;
      qVar26 = QList<QObject_*>::size(&local_210);
      if (qVar26 <= lVar23) break;
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_fffffffffffffc70,
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      pQVar20 = qobject_cast<QWidget*>
                          ((QObject *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
      ;
      if (((pQVar20 != (QWidget *)0x0) && (bVar2 = isVisible((QWidget *)0x37c544), bVar2)) &&
         (bVar2 = isWindow((QWidget *)in_stack_fffffffffffffc70), !bVar2)) {
        QCoreApplication::sendEvent(&pQVar20->super_QObject,&in_RSI->super_QEvent);
      }
      local_2c4 = local_2c4 + 1;
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x37c595);
    break;
  case DynamicPropertyChange:
    QDynamicPropertyChangeEvent::propertyName
              ((QDynamicPropertyChangeEvent *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    qVar26 = QByteArray::size(&local_228);
    if (qVar26 == 0xd) {
      QByteArray::operator_cast_to_char_((QByteArray *)0x37c731);
      iVar15 = qstrncmp((char *)CONCAT26(in_stack_fffffffffffffc86,
                                         CONCAT24(in_stack_fffffffffffffc84,
                                                  in_stack_fffffffffffffc80)),
                        (char *)in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
      if (iVar15 == 0) {
        QByteArray::constData((QByteArray *)0x37c75b);
        QObject::property((char *)&local_88);
        qVar6 = ::QVariant::toUInt((bool *)&local_88);
        ::QVariant::~QVariant(&local_88);
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37c7b1);
        if (!bVar2) {
          QWidgetPrivate::createExtra(in_stack_fffffffffffffc70);
        }
        cVar4 = QByteArray::at((QByteArray *)
                               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                               0x37c7d4);
        if (cVar4 == 'X') {
          pQVar27 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37c805);
          pQVar27->customDpiX = qVar6;
          in_stack_fffffffffffffc86 = qVar6;
        }
        else if (cVar4 == 'Y') {
          pQVar27 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37c83a);
          pQVar27->customDpiY = qVar6;
          in_stack_fffffffffffffc84 = qVar6;
        }
        QWidgetPrivate::updateFont
                  ((QWidgetPrivate *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                   in_stack_fffffffffffffce0);
      }
    }
    pQVar28 = windowHandle((QWidget *)in_stack_fffffffffffffc70);
    if (pQVar28 != (QWindow *)0x0) {
      QByteArray::operator_cast_to_char_((QByteArray *)0x37c889);
      iVar15 = qstrncmp((char *)CONCAT26(in_stack_fffffffffffffc86,
                                         CONCAT24(in_stack_fffffffffffffc84,
                                                  in_stack_fffffffffffffc80)),
                        (char *)in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
      if (iVar15 == 0) {
        pQVar28 = windowHandle((QWidget *)in_stack_fffffffffffffc70);
        QByteArray::operator_cast_to_char_((QByteArray *)0x37c8c1);
        QByteArray::operator_cast_to_char_((QByteArray *)0x37c8d3);
        QObject::property((char *)&local_a8);
        QObject::setProperty
                  ((QObject *)pQVar28,
                   (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                   (QVariant *)0x37c902);
        ::QVariant::~QVariant(&local_a8);
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x37c91c);
    goto switchD_0037b06a_caseD_f;
  case TouchBegin:
  case TouchUpdate:
  case TouchEnd:
  case TouchCancel:
    QEvent::ignore(&in_RSI->super_QEvent);
    break;
  case Gesture:
    QEvent::ignore(&in_RSI->super_QEvent);
    break;
  case InputMethodQuery:
    local_124.super_QFlagsStorage<Qt::InputMethodQuery>.i =
         (QFlagsStorage<Qt::InputMethodQuery>)0xaaaaaaaa;
    local_124.super_QFlagsStorage<Qt::InputMethodQuery>.i =
         (QFlagsStorage<Qt::InputMethodQuery>)
         QInputMethodQueryEvent::queries((QInputMethodQueryEvent *)in_stack_fffffffffffffc70);
    __addr_00 = extraout_RDX;
    for (local_26c = 0; local_26c < 0x20; local_26c = local_26c + 1) {
      __addr_len = (uint *)(ulong)local_26c;
      pQVar29 = (QUpdateLaterEvent *)(ulong)(uint)(1 << ((byte)local_26c & 0x1f));
      local_128.super_QFlagsStorage<Qt::InputMethodQuery>.i =
           (QFlagsStorage<Qt::InputMethodQuery>)
           QFlags<Qt::InputMethodQuery>::operator&
                     ((QFlags<Qt::InputMethodQuery> *)in_stack_fffffffffffffc70,
                      in_stack_fffffffffffffc6c);
      IVar11 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_128);
      __addr_00 = extraout_RDX_00;
      if (IVar11 != 0) {
        local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)in_RDI + 400))(&local_48,in_RDI,IVar11);
        if (((IVar11 == 1) &&
            (bVar2 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffc70), !bVar2)) &&
           (bVar2 = isEnabled((QWidget *)0x37b63d), bVar2)) {
          bVar2 = testAttribute((QWidget *)in_stack_fffffffffffffc78,
                                (WidgetAttribute)((ulong)in_stack_fffffffffffffc70 >> 0x20));
          ::QVariant::QVariant(&local_68,bVar2);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffffc78,(QVariant *)in_stack_fffffffffffffc70);
          ::QVariant::~QVariant(&local_68);
        }
        pQVar29 = (QUpdateLaterEvent *)(ulong)IVar11;
        QInputMethodQueryEvent::setValue((InputMethodQuery)in_RSI,(QVariant *)pQVar29);
        ::QVariant::~QVariant((QVariant *)&local_48);
        __addr_00 = extraout_RDX_01;
      }
    }
    QEvent::accept(&in_RSI->super_QEvent,(int)pQVar29,__addr_00,__addr_len);
    break;
  case StyleAnimationUpdate:
    bVar2 = isVisible((QWidget *)0x37c1b1);
    if (bVar2) {
      pQVar20 = window((QWidget *)
                       CONCAT26(in_stack_fffffffffffffc86,
                                CONCAT24(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)));
      bVar2 = isMinimized(pQVar20);
      if (!bVar2) {
        QEvent::accept(&in_RSI->super_QEvent,iVar15,__addr_01,__addr_len);
        update((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      }
    }
    break;
  case ScreenChangeInternal:
    pQVar22 = QWidgetPrivate::maybeTopData(in_stack_fffffffffffffc70);
    if (pQVar22 != (QTLWExtra *)0x0) {
      if ((pQVar22->window == (QWidgetWindow *)0x0) || (lVar23 = QWindow::handle(), lVar23 == 0)) {
        pQVar16 = (QWidgetPrivate *)0x0;
      }
      else {
        plVar24 = (long *)QWindow::handle();
        pQVar16 = (QWidgetPrivate *)(**(code **)(*plVar24 + 0x68))();
      }
      QWidgetPrivate::setWinId
                (pQVar16,CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    break;
  case PlatformSurface:
    SVar8 = QPlatformSurfaceEvent::surfaceEventType((QPlatformSurfaceEvent *)in_RSI);
    uVar30 = (undefined2)((ulong)in_stack_fffffffffffffc98 >> 0x30);
    attribute = (WidgetAttribute)((ulong)in_stack_fffffffffffffc70 >> 0x20);
    if (SVar8 == SurfaceCreated) {
      bVar2 = testAttribute((QWidget *)in_stack_fffffffffffffc78,attribute);
      if (!bVar2) {
        create((QWidget *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffcc8,SUB21((ushort)uVar31 >> 8,0),SUB21(uVar31,0));
      }
    }
    else if (SVar8 == SurfaceAboutToBeDestroyed) {
      bVar2 = testAttribute((QWidget *)in_stack_fffffffffffffc78,attribute);
      if (bVar2) {
        destroy((QWidget *)in_stack_fffffffffffffca0,SUB21((ushort)uVar30 >> 8,0),SUB21(uVar30,0));
      }
    }
    break;
  case DevicePixelRatioChange:
    pQVar25 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                        ((QExplicitlySharedDataPointer<QFontPrivate> *)0x37c66f);
    iVar15 = *(int *)(pQVar25 + 0x78);
    iVar14 = QPaintDevice::logicalDpiY((QPaintDevice *)0x37c687);
    if (iVar15 != iVar14) {
      QWidgetPrivate::updateFont
                ((QWidgetPrivate *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 in_stack_fffffffffffffce0);
    }
    *(uint *)&pQVar16->field_0x250 = *(uint *)&pQVar16->field_0x250 & 0xf7ffffff | 0x8000000;
  }
  local_229 = true;
LAB_0037c944:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_229;
  }
  __stack_chk_fail();
switchD_0037b06a_caseD_f:
  bVar5 = QObject::event((QEvent *)in_RDI);
  local_229 = (bool)(bVar5 & 1);
  goto LAB_0037c944;
}

Assistant:

bool QWidget::event(QEvent *event)
{
    Q_D(QWidget);

    // ignore mouse and key events when disabled
    if (!isEnabled()) {
        switch(event->type()) {
        case QEvent::TabletPress:
        case QEvent::TabletRelease:
        case QEvent::TabletMove:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseMove:
        case QEvent::TouchBegin:
        case QEvent::TouchUpdate:
        case QEvent::TouchEnd:
        case QEvent::TouchCancel:
        case QEvent::ContextMenu:
        case QEvent::KeyPress:
        case QEvent::KeyRelease:
#if QT_CONFIG(wheelevent)
        case QEvent::Wheel:
#endif
            return false;
        default:
            break;
        }
    }
    switch (event->type()) {
    case QEvent::PlatformSurface: {
        // Sync up QWidget's view of whether or not the widget has been created
        switch (static_cast<QPlatformSurfaceEvent*>(event)->surfaceEventType()) {
        case QPlatformSurfaceEvent::SurfaceCreated:
            if (!testAttribute(Qt::WA_WState_Created))
                create();
            break;
        case QPlatformSurfaceEvent::SurfaceAboutToBeDestroyed:
            if (testAttribute(Qt::WA_WState_Created)) {
                // Child windows have already been destroyed by QWindow,
                // so we skip them here.
                destroy(false, false);
            }
            break;
        }
        break;
    }
    case QEvent::MouseMove:
        mouseMoveEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonPress:
        mousePressEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonRelease:
        mouseReleaseEvent((QMouseEvent*)event);
        break;

    case QEvent::MouseButtonDblClick:
        mouseDoubleClickEvent((QMouseEvent*)event);
        break;
#if QT_CONFIG(wheelevent)
    case QEvent::Wheel:
        wheelEvent((QWheelEvent*)event);
        break;
#endif
#if QT_CONFIG(tabletevent)
    case QEvent::TabletMove:
        if (static_cast<QTabletEvent *>(event)->buttons() == Qt::NoButton && !testAttribute(Qt::WA_TabletTracking))
            break;
        Q_FALLTHROUGH();
    case QEvent::TabletPress:
    case QEvent::TabletRelease:
        tabletEvent((QTabletEvent*)event);
        break;
#endif
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent *>(event);
        bool res = false;
        if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
            if (k->key() == Qt::Key_Backtab
                || (k->key() == Qt::Key_Tab && (k->modifiers() & Qt::ShiftModifier)))
                res = focusNextPrevChild(false);
            else if (k->key() == Qt::Key_Tab)
                res = focusNextPrevChild(true);
            if (res)
                break;
        }
        keyPressEvent(k);
#ifdef QT_KEYPAD_NAVIGATION
        if (!k->isAccepted() && QApplication::keypadNavigationEnabled()
            && !(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier | Qt::ShiftModifier))) {
            if (QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder) {
                if (k->key() == Qt::Key_Up)
                    res = focusNextPrevChild(false);
                else if (k->key() == Qt::Key_Down)
                    res = focusNextPrevChild(true);
            } else if (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
                if (k->key() == Qt::Key_Up)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionNorth);
                else if (k->key() == Qt::Key_Right)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionEast);
                else if (k->key() == Qt::Key_Down)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionSouth);
                else if (k->key() == Qt::Key_Left)
                    res = QWidgetPrivate::navigateToDirection(QWidgetPrivate::DirectionWest);
            }
            if (res) {
                k->accept();
                break;
            }
        }
#endif
#if QT_CONFIG(whatsthis)
        if (!k->isAccepted()
            && k->modifiers() & Qt::ShiftModifier && k->key() == Qt::Key_F1
            && d->whatsThis.size()) {
            QWhatsThis::showText(mapToGlobal(inputMethodQuery(Qt::ImCursorRectangle).toRect().center()), d->whatsThis, this);
            k->accept();
        }
#endif
    }
        break;

    case QEvent::KeyRelease:
        keyReleaseEvent((QKeyEvent*)event);
        Q_FALLTHROUGH();
    case QEvent::ShortcutOverride:
        break;

    case QEvent::InputMethod:
        inputMethodEvent((QInputMethodEvent *) event);
        break;

    case QEvent::InputMethodQuery: {
            QInputMethodQueryEvent *query = static_cast<QInputMethodQueryEvent *>(event);
            Qt::InputMethodQueries queries = query->queries();
            for (uint i = 0; i < 32; ++i) {
                Qt::InputMethodQuery q = (Qt::InputMethodQuery)(int)(queries & (1<<i));
                if (q) {
                    QVariant v = inputMethodQuery(q);
                    if (q == Qt::ImEnabled && !v.isValid() && isEnabled()) {
                        // Qt:ImEnabled was added in Qt 5.3. So not all widgets support it, even
                        // if they implement IM otherwise (by overriding inputMethodQuery()). Instead
                        // they set the widget attribute Qt::WA_InputMethodEnabled. But this attribute
                        // will only be set if the widget supports IM _and_ is not read-only. So for
                        // read-only widgets, not all IM features will be supported when ImEnabled is
                        // not implemented explicitly (e.g selection handles for read-only widgets on iOS).
                        v = QVariant(testAttribute(Qt::WA_InputMethodEnabled));
                    }
                    query->setValue(q, v);
                }
            }
            query->accept();
        }
        break;

    case QEvent::PolishRequest:
        ensurePolished();
        break;

    case QEvent::Polish: {
        style()->polish(this);
        setAttribute(Qt::WA_WState_Polished);
        if (!QApplication::font(this).isCopyOf(QApplication::font()))
            d->resolveFont();
        if (!QApplication::palette(this).isCopyOf(QGuiApplication::palette()))
            d->resolvePalette();
    }
        break;

    case QEvent::ApplicationWindowIconChange:
        if (isWindow() && !testAttribute(Qt::WA_SetWindowIcon)) {
            d->setWindowIcon_sys();
            d->setWindowIcon_helper();
        }
        break;
    case QEvent::FocusIn:
        focusInEvent((QFocusEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::FocusOut:
        focusOutEvent((QFocusEvent*)event);
        break;

    case QEvent::Enter:
#if QT_CONFIG(statustip)
        if (d->statusTip.size()) {
            QStatusTipEvent tip(d->statusTip);
            QCoreApplication::sendEvent(const_cast<QWidget *>(this), &tip);
        }
#endif
        enterEvent(static_cast<QEnterEvent*>(event));
        break;

    case QEvent::Leave:
#if QT_CONFIG(statustip)
        if (d->statusTip.size()) {
            QString empty;
            QStatusTipEvent tip(empty);
            QCoreApplication::sendEvent(const_cast<QWidget *>(this), &tip);
        }
#endif
        leaveEvent(event);
        break;

    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
        update();
        break;

    case QEvent::Paint:
        // At this point the event has to be delivered, regardless
        // whether the widget isVisible() or not because it
        // already went through the filters
        paintEvent((QPaintEvent*)event);
        break;

    case QEvent::Move:
        moveEvent((QMoveEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::Resize:
        resizeEvent((QResizeEvent*)event);
        d->updateWidgetTransform(event);
        break;

    case QEvent::Close:
        closeEvent((QCloseEvent *)event);
        break;

#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        switch (data->context_menu_policy) {
        case Qt::PreventContextMenu:
            break;
        case Qt::DefaultContextMenu:
            contextMenuEvent(static_cast<QContextMenuEvent *>(event));
            break;
        case Qt::CustomContextMenu:
            emit customContextMenuRequested(static_cast<QContextMenuEvent *>(event)->pos());
            break;
#if QT_CONFIG(menu)
        case Qt::ActionsContextMenu:
            if (d->actions.size()) {
                QMenu::exec(d->actions, static_cast<QContextMenuEvent *>(event)->globalPos(),
                            nullptr, this);
                break;
            }
            Q_FALLTHROUGH();
#endif
        default:
            event->ignore();
            break;
        }
        break;
#endif // QT_NO_CONTEXTMENU

#if QT_CONFIG(draganddrop)
    case QEvent::Drop:
        dropEvent((QDropEvent*) event);
        break;

    case QEvent::DragEnter:
        dragEnterEvent((QDragEnterEvent*) event);
        break;

    case QEvent::DragMove:
        dragMoveEvent((QDragMoveEvent*) event);
        break;

    case QEvent::DragLeave:
        dragLeaveEvent((QDragLeaveEvent*) event);
        break;
#endif

    case QEvent::Show:
        showEvent((QShowEvent*) event);
        break;

    case QEvent::Hide:
        hideEvent((QHideEvent*) event);
        break;

    case QEvent::ShowWindowRequest:
        if (!isHidden())
            d->show_sys();
        break;

    case QEvent::ApplicationFontChange:
        d->resolveFont();
        break;
    case QEvent::ApplicationPaletteChange:
        if (!(windowType() == Qt::Desktop))
            d->resolvePalette();
        break;

    case QEvent::ToolBarChange:
    case QEvent::ActivationChange:
    case QEvent::EnabledChange:
    case QEvent::FontChange:
    case QEvent::StyleChange:
    case QEvent::PaletteChange:
    case QEvent::WindowTitleChange:
    case QEvent::IconTextChange:
    case QEvent::ModifiedChange:
    case QEvent::MouseTrackingChange:
    case QEvent::TabletTrackingChange:
    case QEvent::ParentChange:
    case QEvent::LocaleChange:
    case QEvent::MacSizeChange:
    case QEvent::ContentsRectChange:
    case QEvent::ThemeChange:
    case QEvent::ReadOnlyChange:
        changeEvent(event);
        break;

    case QEvent::WindowStateChange: {
        const bool wasMinimized = static_cast<const QWindowStateChangeEvent *>(event)->oldState() & Qt::WindowMinimized;
        if (wasMinimized != isMinimized()) {
            QWidget *widget = const_cast<QWidget *>(this);
            if (wasMinimized) {
                // Always send the spontaneous events here, otherwise it can break the application!
                if (!d->childrenShownByExpose) {
                    // Show widgets only when they are not yet shown by the expose event
                    d->showChildren(true);
                    QShowEvent showEvent;
                    QCoreApplication::sendSpontaneousEvent(widget, &showEvent);
                }
                d->childrenHiddenByWState = false; // Set it always to "false" when window is restored
            } else {
                QHideEvent hideEvent;
                QCoreApplication::sendSpontaneousEvent(widget, &hideEvent);
                d->hideChildren(true);
                d->childrenHiddenByWState = true;
            }
            d->childrenShownByExpose = false; // Set it always to "false" when window state changes
        }
        changeEvent(event);
    }
        break;

    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate: {
        if (isVisible() && !palette().isEqual(QPalette::Active, QPalette::Inactive))
            update();
        QList<QObject*> childList = d->children;
        for (int i = 0; i < childList.size(); ++i) {
            QWidget *w = qobject_cast<QWidget *>(childList.at(i));
            if (w && w->isVisible() && !w->isWindow())
                QCoreApplication::sendEvent(w, event);
        }
        break; }

    case QEvent::LanguageChange:
        changeEvent(event);
        {
            QList<QObject*> childList = d->children;
            for (int i = 0; i < childList.size(); ++i) {
                QObject *o = childList.at(i);
                if (o)
                    QCoreApplication::sendEvent(o, event);
            }
        }
        update();
        break;

    case QEvent::ApplicationLayoutDirectionChange:
        d->resolveLayoutDirection();
        break;

    case QEvent::LayoutDirectionChange:
        if (d->layout)
            d->layout->invalidate();
        update();
        changeEvent(event);
        break;
    case QEvent::UpdateRequest:
        d->syncBackingStore();
        break;
    case QEvent::UpdateLater:
        update(static_cast<QUpdateLaterEvent*>(event)->region());
        break;
    case QEvent::StyleAnimationUpdate:
        if (isVisible() && !window()->isMinimized()) {
            event->accept();
            update();
        }
        break;

    case QEvent::WindowBlocked:
    case QEvent::WindowUnblocked:
        if (!d->children.isEmpty()) {
            QWidget *modalWidget = QApplication::activeModalWidget();
            for (int i = 0; i < d->children.size(); ++i) {
                QObject *o = d->children.at(i);
                if (o && o != modalWidget && o->isWidgetType()) {
                    QWidget *w  = static_cast<QWidget *>(o);
                    // do not forward the event to child windows; QApplication does this for us
                    if (!w->isWindow())
                        QCoreApplication::sendEvent(w, event);
                }
            }
        }
        break;
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        if (!d->toolTip.isEmpty())
            QToolTip::showText(static_cast<QHelpEvent*>(event)->globalPos(), d->toolTip, this, QRect(), d->toolTipDuration);
        else
            event->ignore();
        break;
#endif
#if QT_CONFIG(whatsthis)
    case QEvent::WhatsThis:
        if (d->whatsThis.size())
            QWhatsThis::showText(static_cast<QHelpEvent *>(event)->globalPos(), d->whatsThis, this);
        else
            event->ignore();
        break;
    case QEvent::QueryWhatsThis:
        if (d->whatsThis.isEmpty())
            event->ignore();
        break;
#endif
    case QEvent::EmbeddingControl:
        d->topData()->frameStrut.setCoords(0 ,0, 0, 0);
        data->fstrut_dirty = false;
        break;
#ifndef QT_NO_ACTION
    case QEvent::ActionAdded:
    case QEvent::ActionRemoved:
    case QEvent::ActionChanged:
        actionEvent((QActionEvent*)event);
        break;
#endif

    case QEvent::KeyboardLayoutChange:
        {
            changeEvent(event);

            // inform children of the change
            QList<QObject*> childList = d->children;
            for (int i = 0; i < childList.size(); ++i) {
                QWidget *w = qobject_cast<QWidget *>(childList.at(i));
                if (w && w->isVisible() && !w->isWindow())
                    QCoreApplication::sendEvent(w, event);
            }
            break;
        }
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    case QEvent::TouchCancel:
    {
        event->ignore();
        break;
    }
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
        event->ignore();
        break;
#endif
    case QEvent::ScreenChangeInternal:
        if (const QTLWExtra *te = d->maybeTopData()) {
            const QWindow *win = te->window;
            d->setWinId((win && win->handle()) ? win->handle()->winId() : 0);
        }
        break;
    case QEvent::DevicePixelRatioChange:
        if (d->data.fnt.d->dpi != logicalDpiY())
            d->updateFont(d->data.fnt);
        d->renderToTextureReallyDirty = 1;
        break;
    case QEvent::DynamicPropertyChange: {
        const QByteArray &propName = static_cast<QDynamicPropertyChangeEvent *>(event)->propertyName();
        if (propName.size() == 13 && !qstrncmp(propName, "_q_customDpi", 12)) {
            uint value = property(propName.constData()).toUInt();
            if (!d->extra)
                d->createExtra();
            const char axis = propName.at(12);
            if (axis == 'X')
                d->extra->customDpiX = value;
            else if (axis == 'Y')
                d->extra->customDpiY = value;
            d->updateFont(d->data.fnt);
        }
        if (windowHandle() && !qstrncmp(propName, "_q_platform_", 12))
            windowHandle()->setProperty(propName, property(propName));
        Q_FALLTHROUGH();
    }
    default:
        return QObject::event(event);
    }
    return true;
}